

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O3

void LowererMD::LegalizeSrc<false>(Instr *instr,Opnd *src,LegalForms forms)

{
  LegalForms LVar1;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  OpCode assignOpcode;
  undefined4 *puVar5;
  RegOpnd *dstOpnd;
  Instr *pIVar6;
  IntConstOpnd *this;
  IndirOpnd *pIVar7;
  Opnd *this_00;
  AddrOpndKind kind;
  char *message;
  char *error;
  uint lineNumber;
  _func_int **address;
  Func *this_01;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x807,"(instr)","instr");
    if (!bVar3) goto LAB_00667523;
    *puVar5 = 0;
  }
  if (src == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x808,"(src)","src");
    if (!bVar3) goto LAB_00667523;
    *puVar5 = 0;
  }
  if ((instr->m_src1 != src) && (instr->m_src2 != src)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x809,"(src == instr->GetSrc1() || src == instr->GetSrc2())",
                       "src == instr->GetSrc1() || src == instr->GetSrc2()");
    if (!bVar3) goto LAB_00667523;
    *puVar5 = 0;
  }
  if (forms == L_None) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x80a,"(forms)","forms");
    if (!bVar3) goto LAB_00667523;
    *puVar5 = 0;
  }
  OVar4 = IR::Opnd::GetKind(src);
  switch(OVar4) {
  case OpndKindIntConst:
    if ((forms & L_Ptr) != L_None) {
      return;
    }
    OVar4 = IR::Opnd::GetKind(src);
    if (OVar4 != OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
      if (!bVar3) goto LAB_00667523;
      *puVar5 = 0;
    }
    if (TySize[src->m_type] == 8) {
      if ((instr->field_0x36 & 0x20) == 0) {
        if ((_func_int **)(long)(int)src[1]._vptr_Opnd == src[1]._vptr_Opnd) goto LAB_00667053;
        if ((forms & L_Reg) == L_None) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                             ,0x82f,"(forms & L_Reg)","forms & L_Reg");
          if (!bVar3) goto LAB_00667523;
          *puVar5 = 0;
        }
        this_00 = IR::Opnd::Copy(src,instr->m_func);
        this = IR::Opnd::AsIntConstOpnd(this_00);
        this_01 = instr->m_func->topFunc;
        address = src[1]._vptr_Opnd;
        kind = AddrOpndKindConstantAddress;
        goto LAB_00667472;
      }
      break;
    }
LAB_00667053:
    LVar1 = forms & L_Imm32;
    goto joined_r0x006670e7;
  case OpndKindInt64Const:
    if ((forms & L_Ptr) != L_None) {
      return;
    }
    OVar4 = IR::Opnd::GetKind(src);
    if (OVar4 != OpndKindInt64Const) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xe4,"(this->IsInt64ConstOpnd())","Bad call to AsInt64ConstOpnd()");
      if (!bVar3) goto LAB_00667523;
      *puVar5 = 0;
    }
    if ((forms & L_Imm32) != L_None) {
      if (TySize[src->m_type] != 8) {
        return;
      }
      if (((instr->field_0x36 & 0x20) == 0) &&
         ((_func_int **)(long)(int)src[1]._vptr_Opnd == src[1]._vptr_Opnd)) {
        return;
      }
    }
    if ((forms & L_Reg) == L_None) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x851,"(forms & L_Reg)","forms & L_Reg");
      if (!bVar3) goto LAB_00667523;
      *puVar5 = 0;
    }
    dstOpnd = IR::RegOpnd::New(src->m_type,instr->m_func);
    pIVar6 = IR::Instr::New(MOV,&dstOpnd->super_Opnd,src,instr->m_func);
    IR::Instr::InsertBefore(instr,pIVar6);
    IR::Instr::ReplaceSrc(instr,src,&dstOpnd->super_Opnd);
    return;
  case OpndKindFloatConst:
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x899,"(false)","false");
    if (!bVar3) goto LAB_00667523;
    *puVar5 = 0;
    break;
  case OpndKindHelperCall:
  case OpndKindLabel:
    if ((instr->field_0x36 & 0x20) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x894,"(!instr->isInlineeEntryInstr)","!instr->isInlineeEntryInstr");
      if (!bVar3) goto LAB_00667523;
      *puVar5 = 0;
    }
    if ((forms & L_Ptr) != L_None) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    error = "(forms & L_Ptr)";
    message = "forms & L_Ptr";
    lineNumber = 0x895;
    goto LAB_00666f48;
  case OpndKindSym:
  case OpndKindIndir:
    goto switchD_00666d34_caseD_7;
  case OpndKindReg:
    if ((forms & L_Reg) != L_None) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    error = "(forms & L_Reg)";
    message = "forms & L_Reg";
    lineNumber = 0x811;
LAB_00666f48:
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,lineNumber,error,message);
    if (bVar3) {
      *puVar5 = 0;
      return;
    }
    goto LAB_00667523;
  case OpndKindAddr:
    if ((forms & L_Ptr) != L_None) {
      return;
    }
    OVar4 = IR::Opnd::GetKind(src);
    if (OVar4 != OpndKindAddr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
      if (!bVar3) goto LAB_00667523;
      *puVar5 = 0;
    }
    if ((forms & L_Imm32) == L_None) {
      if ((instr->field_0x36 & 0x20) != 0) {
LAB_00667338:
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x86e,"(!instr->isInlineeEntryInstr)","!instr->isInlineeEntryInstr");
        if (!bVar3) goto LAB_00667523;
        *puVar5 = 0;
      }
    }
    else {
      if (TySize[src->m_type] != 8) {
        return;
      }
      if ((instr->field_0x36 & 0x20) != 0) goto LAB_00667338;
      if ((_func_int **)(long)(int)src[2]._vptr_Opnd == src[2]._vptr_Opnd) {
        return;
      }
    }
    if ((forms & L_Reg) == L_None) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x86f,"(forms & L_Reg)","forms & L_Reg");
      if (!bVar3) goto LAB_00667523;
      *puVar5 = 0;
    }
    this = (IntConstOpnd *)IR::Opnd::Copy(src,instr->m_func);
    OVar4 = IR::Opnd::GetKind((Opnd *)this);
    if (OVar4 != OpndKindAddr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
      if (!bVar3) goto LAB_00667523;
      *puVar5 = 0;
    }
    this_01 = instr->m_func->topFunc;
    address = src[2]._vptr_Opnd;
    kind = *(AddrOpndKind *)((long)&src[2].m_valueType.field_0.bits + 1);
LAB_00667472:
    pIVar7 = Func::GetConstantAddressIndirOpnd
                       (this_01,(intptr_t)address,&this->super_Opnd,kind,TyUint64,MOV);
    bVar3 = HoistLargeConstant(pIVar7,src,instr);
    if (bVar3) {
      return;
    }
    break;
  case OpndKindMemRef:
    OVar4 = IR::Opnd::GetKind(src);
    if (OVar4 != OpndKindMemRef) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x1ec,"(this->IsMemRefOpnd())","Bad call to AsMemRefOpnd()");
      if (!bVar3) goto LAB_00667523;
      *puVar5 = 0;
    }
    if ((_func_int **)(long)(int)src[1]._vptr_Opnd != src[1]._vptr_Opnd) {
      src = &IR::Instr::HoistMemRefAddress(instr,(MemRefOpnd *)src,MOV)->super_Opnd;
    }
    goto switchD_00666d34_caseD_7;
  }
switchD_00666d34_caseD_3:
  if ((forms & L_Reg) == L_None) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x8a4,"(forms & L_Reg)","forms & L_Reg");
    if (!bVar3) goto LAB_00667523;
    *puVar5 = 0;
  }
  if ((instr->m_dst != (Opnd *)0x0) && (bVar3 = IR::Opnd::IsEqual(instr->m_dst,src), bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x8a5,"(!(instr->GetDst() && instr->GetDst()->IsEqual(src)))",
                       "!(instr->GetDst() && instr->GetDst()->IsEqual(src))");
    if (!bVar3) {
LAB_00667523:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  assignOpcode = LowererMDArch::GetAssignOp((((IndirOpnd *)src)->super_Opnd).m_type);
  pIVar7 = (IndirOpnd *)instr->m_src2;
  if ((IndirOpnd *)src != pIVar7) {
    if (pIVar7 == (IndirOpnd *)0x0) {
      pIVar6 = IR::Instr::HoistSrc1(instr,assignOpcode,RegNOREG,(StackSym *)0x0);
    }
    else {
      bVar3 = IR::Opnd::IsEqual(src,(Opnd *)pIVar7);
      pIVar6 = IR::Instr::HoistSrc1(instr,assignOpcode,RegNOREG,(StackSym *)0x0);
      if (bVar3) {
        IR::Instr::ReplaceSrc2(instr,pIVar6->m_dst);
      }
    }
    *(ushort *)&pIVar6->field_0x36 =
         *(ushort *)&pIVar6->field_0x36 & 0xffdf | *(ushort *)&instr->field_0x36 & 0x20;
    instr->field_0x36 = instr->field_0x36 & 0xdf;
    return;
  }
  IR::Instr::HoistSrc2(instr,assignOpcode,RegNOREG,(StackSym *)0x0);
  return;
switchD_00666d34_caseD_7:
  LVar1 = forms & L_Mem;
joined_r0x006670e7:
  if (LVar1 != L_None) {
    return;
  }
  goto switchD_00666d34_caseD_3;
}

Assistant:

void LowererMD::LegalizeSrc(IR::Instr *const instr, IR::Opnd *src, const LegalForms forms)
{
    Assert(instr);
    Assert(src);
    Assert(src == instr->GetSrc1() || src == instr->GetSrc2());
    Assert(forms);
#ifndef _M_X64
    AssertMsg(!src->IsInt64() || src->IsMemoryOpnd(), "Int64 supported only on x64");
#endif
    switch(src->GetKind())
    {
        case IR::OpndKindReg:
            Assert(forms & L_Reg);
            return;

        case IR::OpndKindIntConst:
            if(forms & L_Ptr)
            {
                return;
            }
#ifdef _M_X64
            {
                IR::IntConstOpnd * intOpnd = src->AsIntConstOpnd();
                if ((TySize[intOpnd->GetType()] != 8) ||
                    (!instr->isInlineeEntryInstr && Math::FitsInDWord(intOpnd->GetValue())))
                {
                    if (forms & L_Imm32)
                    {
                        // the constant fits in 32-bit, no need to hoist
                        return;
                    }
                    break;
                }
                if (verify)
                {
                    AssertMsg(false, "IntConstOpnd doesn't fit in 32 bits. Missing legalization");
                    return;
                }
                // The actual value for inlinee entry instr isn't determined until encoder
                // So it need to be hoisted conventionally.
                if (!instr->isInlineeEntryInstr)
                {
                    Assert(forms & L_Reg);
                    IR::IntConstOpnd * newIntOpnd = intOpnd->Copy(instr->m_func)->AsIntConstOpnd();
                    IR::IndirOpnd * indirOpnd = instr->m_func->GetTopFunc()->GetConstantAddressIndirOpnd(intOpnd->GetValue(), newIntOpnd, IR::AddrOpndKindConstantAddress, TyMachPtr, Js::OpCode::MOV);
                    if (HoistLargeConstant(indirOpnd, src, instr))
                    {
                        return;
                    }
                }
            }
#endif
            break;
        case IR::OpndKindFloatConst:
            break; // assume for now that it always needs to be hoisted

        case IR::OpndKindInt64Const:
            if (forms & L_Ptr)
            {
                return;
            }
#ifdef _M_X64
            {
                IR::Int64ConstOpnd * int64Opnd = src->AsInt64ConstOpnd();
                if ((forms & L_Imm32) && ((src->GetSize() != 8) ||
                    (!instr->isInlineeEntryInstr && Math::FitsInDWord(int64Opnd->GetValue()))))
                {
                    // the immediate fits in 32-bit, no need to hoist
                    return;
                }
                if (verify)
                {
                    AssertMsg(false, "Int64ConstOpnd doesn't fit in 32 bits. Missing legalization");
                    return;
                }

                Assert(forms & L_Reg);
                IR::Opnd* regOpnd = IR::RegOpnd::New(src->GetType(), instr->m_func);
                IR::Instr* moveToReg = IR::Instr::New(Js::OpCode::MOV, regOpnd, src, instr->m_func);
                instr->InsertBefore(moveToReg);
                instr->ReplaceSrc(src, regOpnd);
                return;
            }
#endif
            break;
        case IR::OpndKindAddr:
            if (forms & L_Ptr)
            {
                return;
            }
#ifdef _M_X64
            {
                IR::AddrOpnd * addrOpnd = src->AsAddrOpnd();
                if ((forms & L_Imm32) && ((TySize[addrOpnd->GetType()] != 8) ||
                    (!instr->isInlineeEntryInstr && Math::FitsInDWord((size_t)addrOpnd->m_address))))
                {
                    // the address fits in 32-bit, no need to hoist
                    return;
                }
                if (verify)
                {
                    AssertMsg(false, "AddrOpnd doesn't fit in 32 bits. Missing legalization");
                    return;
                }

                Assert(!instr->isInlineeEntryInstr);
                Assert(forms & L_Reg);
                // TODO: michhol, remove cast after making m_address intptr
                IR::AddrOpnd * newAddrOpnd = addrOpnd->Copy(instr->m_func)->AsAddrOpnd();
                IR::IndirOpnd * indirOpnd = instr->m_func->GetTopFunc()->GetConstantAddressIndirOpnd((intptr_t)addrOpnd->m_address, newAddrOpnd, addrOpnd->GetAddrOpndKind(), TyMachPtr, Js::OpCode::MOV);
                if (HoistLargeConstant(indirOpnd, src, instr))
                {
                    return;
                }
            }
#endif
            break;

        case IR::OpndKindMemRef:
        {
            IR::MemRefOpnd *const memRefOpnd = src->AsMemRefOpnd();
            if(!LowererMDArch::IsLegalMemLoc(memRefOpnd))
            {
                if (verify)
                {
                    AssertMsg(false, "Memory reference not legal in src opnd. Missing legalization");
                    return;
                }
                src = instr->HoistMemRefAddress(memRefOpnd, Js::OpCode::MOV);
            }
            // fall through
        }

        case IR::OpndKindSym:
        case IR::OpndKindIndir:
            if(forms & L_Mem)
            {
                return;
            }
            break;

        case IR::OpndKindHelperCall:
        case IR::OpndKindLabel:
            Assert(!instr->isInlineeEntryInstr);
            Assert(forms & L_Ptr);
            return;

        default:
            Assert(false);
            __assume(false);
    }

    if (verify)
    {
        AssertMsg(false, "Src opnd not legal. Missing legalization");
        return;
    }

    // Hoist the src into a reg
    Assert(forms & L_Reg);
    Assert(!(instr->GetDst() && instr->GetDst()->IsEqual(src)));
    const Js::OpCode loadOpCode = GetLoadOp(src->GetType());
    if(src == instr->GetSrc2())
    {
        instr->HoistSrc2(loadOpCode);
        return;
    }
    const bool equalsSrc2 = instr->GetSrc2() && src->IsEqual(instr->GetSrc2());
    IR::Instr * hoistInstr = instr->HoistSrc1(loadOpCode);
    if(equalsSrc2)
    {
        instr->ReplaceSrc2(hoistInstr->GetDst());
    }
    hoistInstr->isInlineeEntryInstr = instr->isInlineeEntryInstr;
    instr->isInlineeEntryInstr = false;
}